

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityDefaultTestRun(UnityTestFunction Func,char *FuncName,int FuncLineNum)

{
  int iVar1;
  
  Unity.CurrentTestLineNumber = (UNITY_UINT)FuncLineNum;
  Unity.NumberOfTests = Unity.NumberOfTests + 1;
  Unity.CurrentDetail1 = (char *)0x0;
  Unity.CurrentDetail2 = (char *)0x0;
  Unity.CurrentTestName = FuncName;
  iVar1 = _setjmp((__jmp_buf_tag *)Unity.AbortFrame);
  if (iVar1 == 0) {
    setUp();
    (*Func)();
  }
  iVar1 = _setjmp((__jmp_buf_tag *)Unity.AbortFrame);
  if (iVar1 == 0) {
    tearDown();
  }
  UnityConcludeTest();
  return;
}

Assistant:

void UnityDefaultTestRun(UnityTestFunction Func, const char* FuncName, const int FuncLineNum)
{
    Unity.CurrentTestName = FuncName;
    Unity.CurrentTestLineNumber = (UNITY_LINE_TYPE)FuncLineNum;
    Unity.NumberOfTests++;
    UNITY_CLR_DETAILS();
    if (TEST_PROTECT())
    {
        setUp();
        Func();
    }
    if (TEST_PROTECT())
    {
        tearDown();
    }
    UnityConcludeTest();
}